

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_ml_prune_rect_partition
               (AV1_COMP *cpi,MACROBLOCK *x,int64_t best_rd,int64_t none_rd,int64_t *split_rd,
               PartitionSearchState *part_state)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  float *in_RCX;
  float *input;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  int unaff_retaddr;
  int in_stack_00000008;
  float probs [3];
  float raw_scores [3];
  int i_3;
  int y_idx;
  int x_idx;
  int i_2;
  int bw;
  buf_2d buf;
  BLOCK_SIZE subsize;
  int split_variance [4];
  int whole_block_variance;
  MACROBLOCKD *xd;
  int i_1;
  int i;
  float features [9];
  float cur_thresh;
  float prob_thresholds [5];
  NN_CONFIG *nn_config;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams *blk_params;
  int *in_stack_000029e8;
  int *in_stack_000029f0;
  float *in_stack_000029f8;
  int in_stack_00002a04;
  ExtPartController *in_stack_00002a08;
  int in_stack_fffffffffffffea8;
  BLOCK_SIZE in_stack_fffffffffffffeaf;
  undefined4 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb4;
  PARTITION_TYPE in_stack_fffffffffffffeb5;
  BLOCK_SIZE in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  MACROBLOCKD *in_stack_fffffffffffffeb8;
  AV1_COMP *in_stack_fffffffffffffec0;
  int n;
  undefined4 in_stack_fffffffffffffec8;
  long local_128;
  undefined1 local_11c [4];
  float local_118;
  float local_114;
  float local_110 [3];
  int local_104;
  int local_100;
  int local_fc;
  uint local_f8;
  uint local_f4;
  long local_f0;
  int local_d8;
  BLOCK_SIZE local_c9;
  uint auStack_c8 [7];
  uint local_ac;
  char *local_a8;
  int local_a0;
  int local_9c;
  float local_98 [5];
  float afStack_84 [6];
  float local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  NN_CONFIG *local_50;
  byte local_41;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = in_R9 + 8;
  local_3c = *(undefined4 *)(in_R9 + 0xc);
  local_40 = *(undefined4 *)(in_R9 + 0x10);
  local_41 = *(byte *)(in_R9 + 0x30);
  if ((2 < local_41) && (in_RDX < 1000000000)) {
    local_128 = in_RDX;
    if (in_RDX < 2) {
      local_128 = 1;
    }
    local_50 = (NN_CONFIG *)0x0;
    local_68 = 0x3c23d70a3c23d70a;
    uStack_60 = 0x3b03126f3b83126f;
    local_58 = 0x3b03126f;
    local_6c = 0.0;
    input = (float *)(ulong)(local_41 - 3);
    switch(input) {
    case (float *)0x0:
      local_50 = &av1_rect_partition_nnconfig_8;
      local_6c = 0.01;
      break;
    default:
      break;
    case (float *)0x3:
      local_50 = &av1_rect_partition_nnconfig_16;
      local_6c = 0.01;
      break;
    case (float *)0x6:
      local_50 = &av1_rect_partition_nnconfig_32;
      local_6c = 0.004;
      break;
    case (float *)0x9:
      local_50 = &av1_rect_partition_nnconfig_64;
      local_6c = 0.002;
      break;
    case (float *)0xc:
      local_50 = &av1_rect_partition_nnconfig_128;
      local_6c = 0.002;
    }
    if (local_50 != (NN_CONFIG *)0x0) {
      for (local_9c = 0; local_9c < 5; local_9c = local_9c + 1) {
        local_98[local_9c] = 1.0;
      }
      if ((0 < (long)in_RCX) && ((long)in_RCX < 1000000000)) {
        local_98[0] = (float)(long)in_RCX / (float)local_128;
      }
      for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
        if ((0 < *(long *)(in_R8 + (long)local_a0 * 8)) &&
           (*(long *)(in_R8 + (long)local_a0 * 8) < 1000000000)) {
          local_98[local_a0 + 1] = (float)*(long *)(in_R8 + (long)local_a0 * 8) / (float)local_128;
        }
      }
      local_a8 = in_RSI + 0x1a0;
      uVar2 = av1_get_perpixel_variance_facade
                        (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         (buf_2d *)
                         CONCAT17(in_stack_fffffffffffffeb7,
                                  CONCAT16(in_stack_fffffffffffffeb6,
                                           CONCAT15(in_stack_fffffffffffffeb5,
                                                    CONCAT14(in_stack_fffffffffffffeb4,
                                                             in_stack_fffffffffffffeb0)))),
                         in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8);
      if ((int)uVar2 < 2) {
        uVar2 = 1;
      }
      local_ac = uVar2;
      local_c9 = get_partition_subsize(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb5);
      local_d8 = *(int *)(in_RSI + 0x48);
      local_f4 = (uint)block_size_wide[local_41];
      for (local_f8 = 0; (int)local_f8 < 4; local_f8 = local_f8 + 1) {
        local_fc = (int)((local_f8 & 1) * local_f4) / 2;
        local_100 = (int)(((int)local_f8 >> 1) * local_f4) / 2;
        local_f0 = *(long *)(in_RSI + 0x30) + (long)local_fc + (long)(local_100 * local_d8);
        uVar3 = av1_get_perpixel_variance_facade
                          (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                           (buf_2d *)
                           CONCAT17(in_stack_fffffffffffffeb7,
                                    CONCAT16(in_stack_fffffffffffffeb6,
                                             CONCAT15(in_stack_fffffffffffffeb5,
                                                      CONCAT14(in_stack_fffffffffffffeb4,
                                                               in_stack_fffffffffffffeb0)))),
                           in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8);
        auStack_c8[(int)local_f8] = uVar3;
      }
      for (local_104 = 0; local_104 < 4; local_104 = local_104 + 1) {
        local_98[local_104 + 5] = (float)(int)auStack_c8[local_104] / (float)(int)local_ac;
      }
      write_features_to_file
                (in_RSI,SUB81((ulong)local_128 >> 0x38,0),in_RCX,(int)((ulong)in_R8 >> 0x20),
                 (int)in_R8,(BLOCK_SIZE)((ulong)in_R9 >> 0x38),unaff_retaddr,in_stack_00000008);
      n = (int)((ulong)(in_RDI + 0x9d528) >> 0x20);
      frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
      _Var1 = ext_ml_model_decision_after_split_part2
                        (in_stack_00002a08,in_stack_00002a04,in_stack_000029f8,in_stack_000029f0,
                         in_stack_000029e8);
      if (!_Var1) {
        memset(local_110,0,0xc);
        (*av1_nn_predict)(local_98,local_50,1,local_110);
        memset(local_11c,0,0xc);
        av1_nn_softmax(input,(float *)CONCAT44(uVar2,in_stack_fffffffffffffec8),n);
        if (local_118 <= local_6c) {
          *(undefined4 *)(in_R9 + 0x130) = 1;
        }
        if (local_114 <= local_6c) {
          *(undefined4 *)(in_R9 + 0x134) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_ml_prune_rect_partition(AV1_COMP *const cpi, const MACROBLOCK *const x,
                                 int64_t best_rd, int64_t none_rd,
                                 const int64_t *split_rd,
                                 PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  if (bsize < BLOCK_8X8 || best_rd >= 1000000000) return;
  best_rd = AOMMAX(best_rd, 1);
  const NN_CONFIG *nn_config = NULL;
  const float prob_thresholds[5] = { 0.01f, 0.01f, 0.004f, 0.002f, 0.002f };
  float cur_thresh = 0.0f;
  switch (bsize) {
    case BLOCK_8X8:
      nn_config = &av1_rect_partition_nnconfig_8;
      cur_thresh = prob_thresholds[0];
      break;
    case BLOCK_16X16:
      nn_config = &av1_rect_partition_nnconfig_16;
      cur_thresh = prob_thresholds[1];
      break;
    case BLOCK_32X32:
      nn_config = &av1_rect_partition_nnconfig_32;
      cur_thresh = prob_thresholds[2];
      break;
    case BLOCK_64X64:
      nn_config = &av1_rect_partition_nnconfig_64;
      cur_thresh = prob_thresholds[3];
      break;
    case BLOCK_128X128:
      nn_config = &av1_rect_partition_nnconfig_128;
      cur_thresh = prob_thresholds[4];
      break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // 1. Compute input features
  float features[9];

  // RD cost ratios
  for (int i = 0; i < 5; i++) features[i] = 1.0f;
  if (none_rd > 0 && none_rd < 1000000000)
    features[0] = (float)none_rd / (float)best_rd;
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      features[1 + i] = (float)split_rd[i] / (float)best_rd;
  }

  // Variance ratios
  const MACROBLOCKD *const xd = &x->e_mbd;
  int whole_block_variance;
  whole_block_variance = av1_get_perpixel_variance_facade(
      cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  whole_block_variance = AOMMAX(whole_block_variance, 1);

  int split_variance[SUB_PARTITIONS_SPLIT];
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
  struct buf_2d buf;
  buf.stride = x->plane[0].src.stride;
  const int bw = block_size_wide[bsize];
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    const int x_idx = (i & 1) * bw / 2;
    const int y_idx = (i >> 1) * bw / 2;
    buf.buf = x->plane[0].src.buf + x_idx + y_idx * buf.stride;
    split_variance[i] =
        av1_get_perpixel_variance_facade(cpi, xd, &buf, subsize, AOM_PLANE_Y);
  }

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++)
    features[5 + i] = (float)split_variance[i] / (float)whole_block_variance;

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features,
                         /*feature_size=*/9, 5, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_split_part2(
          &cpi->ext_part_controller, frame_is_intra_only(&cpi->common),
          features, &part_state->prune_rect_part[HORZ],
          &part_state->prune_rect_part[VERT])) {
    return;
  }

  // 2. Do the prediction and prune 0-2 partitions based on their probabilities
  float raw_scores[3] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, raw_scores);
  float probs[3] = { 0.0f };
  av1_nn_softmax(raw_scores, probs, 3);

  // probs[0] is the probability of the fact that both rectangular partitions
  // are worse than current best_rd
  if (probs[1] <= cur_thresh) part_state->prune_rect_part[HORZ] = 1;
  if (probs[2] <= cur_thresh) part_state->prune_rect_part[VERT] = 1;
}